

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

void __thiscall
TTD::ExecutionInfoManager::UpdateCurrentStatementInfo
          (ExecutionInfoManager *this,uint bytecodeOffset)

{
  FunctionBody *this_00;
  StatementMap *pSVar1;
  bool bVar2;
  int index;
  SingleCallCounter *pSVar3;
  Utf8SourceInfo *pUVar4;
  StatementMapList *this_01;
  WriteBarrierPtr *this_02;
  StatementMap **ppSVar5;
  bool bVar6;
  bool functionBodyStartUnalignedWithStatementCase;
  bool newstmt;
  StatementMap *pstmt;
  int32 cIndex;
  FunctionBody *fb;
  SingleCallCounter *cfinfo;
  uint bytecodeOffset_local;
  ExecutionInfoManager *this_local;
  
  pSVar3 = GetTopCallCounter(this);
  if (bytecodeOffset < pSVar3->CurrentStatementBytecodeMin ||
      pSVar3->CurrentStatementBytecodeMax < bytecodeOffset) {
    this_00 = pSVar3->Function;
    pUVar4 = Js::FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this_00);
    if (pUVar4 == (Utf8SourceInfo *)0x0) {
      TTDAbort_unrecoverable_error("Should always have a source info.");
    }
    pUVar4 = Js::FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this_00);
    bVar2 = Js::Utf8SourceInfo::GetIsLibraryCode(pUVar4);
    if (!bVar2) {
      index = Js::FunctionBody::GetEnclosingStatementIndexFromByteCode(this_00,bytecodeOffset,true);
      this_01 = Js::FunctionBody::GetStatementMaps(this_00);
      this_02 = (WriteBarrierPtr *)
                JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_01,index);
      ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_StatementMap__(this_02);
      pSVar1 = *ppSVar5;
      bVar2 = false;
      if ((index != pSVar3->CurrentStatementIndex) &&
         (bVar2 = false, (pSVar1->byteCodeSpan).begin <= (int)bytecodeOffset)) {
        bVar2 = (int)bytecodeOffset <= (pSVar1->byteCodeSpan).end;
      }
      bVar6 = false;
      if (pSVar3->CurrentStatementIndex == -1) {
        bVar6 = (pSVar1->byteCodeSpan).begin != bytecodeOffset;
      }
      if ((bVar2) && (!bVar6)) {
        pSVar3->LastStatementIndex = pSVar3->CurrentStatementIndex;
        pSVar3->LastStatementLoopTime = pSVar3->CurrentStatementLoopTime;
        pSVar3->CurrentStatementIndex = index;
        pSVar3->CurrentStatementLoopTime = pSVar3->LoopTime;
        pSVar3->CurrentStatementBytecodeMin = (pSVar1->byteCodeSpan).begin;
        pSVar3->CurrentStatementBytecodeMax = (pSVar1->byteCodeSpan).end;
      }
    }
  }
  return;
}

Assistant:

void ExecutionInfoManager::UpdateCurrentStatementInfo(uint bytecodeOffset)
    {
        SingleCallCounter& cfinfo = this->GetTopCallCounter();

        if((cfinfo.CurrentStatementBytecodeMin <= bytecodeOffset) & (bytecodeOffset <= cfinfo.CurrentStatementBytecodeMax))
        {
            return;
        }
        else
        {
            Js::FunctionBody* fb = cfinfo.Function;
            TTDAssert(fb->GetUtf8SourceInfo() != nullptr, "Should always have a source info.");

            if (!fb->GetUtf8SourceInfo()->GetIsLibraryCode())
            {
                int32 cIndex = fb->GetEnclosingStatementIndexFromByteCode(bytecodeOffset, true);

                //We moved to a new statement
                Js::FunctionBody::StatementMap* pstmt = fb->GetStatementMaps()->Item(cIndex);
                bool newstmt = (cIndex != cfinfo.CurrentStatementIndex && pstmt->byteCodeSpan.begin <= (int)bytecodeOffset && (int)bytecodeOffset <= pstmt->byteCodeSpan.end);

                //Make sure async step back is ok -- We always step back to the first location in a statement and in most cases a function body must start at the first location in a statement.
                //However an await can be in the middle of a statment/expression and is implicitly the start of a function body. So, we must check for that case.
                bool functionBodyStartUnalignedWithStatementCase = (cfinfo.CurrentStatementIndex == -1) && (pstmt->byteCodeSpan.begin != (int)bytecodeOffset);

                if (newstmt && !functionBodyStartUnalignedWithStatementCase)
                {
                    cfinfo.LastStatementIndex = cfinfo.CurrentStatementIndex;
                    cfinfo.LastStatementLoopTime = cfinfo.CurrentStatementLoopTime;

                    cfinfo.CurrentStatementIndex = cIndex;
                    cfinfo.CurrentStatementLoopTime = cfinfo.LoopTime;

                    cfinfo.CurrentStatementBytecodeMin = (uint32)pstmt->byteCodeSpan.begin;
                    cfinfo.CurrentStatementBytecodeMax = (uint32)pstmt->byteCodeSpan.end;

#if ENABLE_FULL_BC_TRACE
                    ULONG srcLine = 0;
                    LONG srcColumn = -1;
                    uint32 startOffset = cfinfo.Function->GetFunctionBody()->GetStatementStartOffset(cfinfo.CurrentStatementIndex);
                    cfinfo.Function->GetFunctionBody()->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);

                    this->m_diagnosticLogger.WriteStmtIndex((uint32)srcLine, (uint32)srcColumn);
#endif
                }
            }
        }
    }